

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA4Application.cpp
# Opt level: O2

void __thiscall PA4Application::update(PA4Application *this)

{
  Program *pPVar1;
  double dVar2;
  allocator<char> local_35;
  float local_34;
  string local_30;
  
  local_34 = this->m_currentTime;
  dVar2 = glfwGetTime();
  this->m_currentTime = (float)dVar2;
  this->m_deltaTime = (float)dVar2 - local_34;
  (**(((this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_OGLStateObject)._vptr_OGLStateObject)();
  pPVar1 = (this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"V",&local_35);
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(pPVar1,&local_30,&this->m_view);
  std::__cxx11::string::~string((string *)&local_30);
  pPVar1 = (this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"P",&local_35);
  Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>(pPVar1,&local_30,&this->m_proj);
  std::__cxx11::string::~string((string *)&local_30);
  (*(((this->m_program).super___shared_ptr<Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_OGLStateObject)._vptr_OGLStateObject[1])();
  continuousKey(this);
  return;
}

Assistant:

void PA4Application::update()
{
  float prevTime = m_currentTime;
  m_currentTime = glfwGetTime();
  m_deltaTime = m_currentTime - prevTime;

  m_program->bind();
  m_program->setUniform("V", m_view);
  m_program->setUniform("P", m_proj);
  m_program->unbind();

  continuousKey();
}